

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O2

Float __thiscall
pbrt::BVHLightSampler::PDF(BVHLightSampler *this,LightSampleContext *ctx,LightHandle *light)

{
  Normal3f *pNVar1;
  float fVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  LightBVHNode **ppLVar7;
  LightBVHNode *this_00;
  Float FVar8;
  float fVar9;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 in_XMM5 [16];
  Point3f PVar12;
  Point3f p;
  initializer_list<float> v;
  Normal3f n;
  Normal3f n_00;
  array<float,_2> ci;
  Float local_50;
  Float local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  undefined1 auVar10 [64];
  
  bVar6 = HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
          ::HasKey(&this->lightToNode,light);
  auVar11 = in_ZMM0._8_56_;
  if (bVar6) {
    ppLVar7 = HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
              ::operator[](&this->lightToNode,light);
    this_00 = *ppLVar7;
    PVar12 = LightSampleContext::p(ctx);
    auVar10._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar11;
    pNVar1 = &ctx->ns;
    local_48._0_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).x;
    local_48._4_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).y;
    fVar2 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    local_38 = auVar10._0_16_;
    uStack_40 = 0;
    FVar8 = LightBounds::Importance
                      (&this_00->lightBounds,PVar12,
                       (Normal3f)pNVar1->super_Tuple3<pbrt::Normal3,_float>);
    fVar9 = 0.0;
    if ((FVar8 != 0.0) || (NAN(FVar8))) {
      fVar9 = 1.0;
      while( true ) {
        auVar4 = local_38;
        if (this_00->parent == (LightBVHNode *)0x0) break;
        PVar12.super_Tuple3<pbrt::Point3,_float>.x = (float)local_38._0_4_;
        PVar12.super_Tuple3<pbrt::Point3,_float>.y = (float)local_38._4_4_;
        n.super_Tuple3<pbrt::Normal3,_float>.z = fVar2;
        n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_48;
        n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_48._4_4_;
        local_38 = auVar4;
        local_50 = LightBounds::Importance
                             (&(this_00->parent->field_2).children[0]->lightBounds,PVar12,n);
        auVar4 = local_38;
        p.super_Tuple3<pbrt::Point3,_float>.z = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
        p.super_Tuple3<pbrt::Point3,_float>.x = (float)local_38._0_4_;
        p.super_Tuple3<pbrt::Point3,_float>.y = (float)local_38._4_4_;
        n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar2;
        n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_48;
        n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_48._4_4_;
        local_38 = auVar4;
        local_4c = LightBounds::Importance
                             (&(this_00->parent->field_2).children[1]->lightBounds,p,n_00);
        v._M_len = 2;
        v._M_array = &local_50;
        pstd::array<float,_2>::array(&ci,v);
        fVar9 = fVar9 * (ci.values[this_00 ==
                                   *(LightBVHNode **)((long)&this_00->parent->field_2 + 8)] /
                        (ci.values[0] + ci.values[1]));
        this_00 = this_00->parent;
      }
      sVar3 = (this->infiniteLights).nStored;
      auVar4 = vcvtusi2ss_avx512f(in_XMM5,sVar3);
      auVar5 = vcvtusi2ss_avx512f(in_XMM5,sVar3 + 1);
      fVar9 = fVar9 * (1.0 - auVar4._0_4_ / auVar5._0_4_);
    }
  }
  else {
    auVar4 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,
                                ((this->infiniteLights).nStored + 1) -
                                (ulong)(this->root == (LightBVHNode *)0x0));
    fVar9 = 1.0 / auVar4._0_4_;
  }
  return fVar9;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const LightSampleContext &ctx, LightHandle light) const {
        if (!lightToNode.HasKey(light))
            return 1.f / (infiniteLights.size() + (root != nullptr ? 1 : 0));

        LightBVHNode *node = lightToNode[light];
        Float pdf = 1;

        Point3f p = ctx.p();
        Normal3f n = ctx.ns;
        if (node->lightBounds.Importance(p, n) == 0)
            return 0;

        for (; node->parent != nullptr; node = node->parent) {
            pstd::array<Float, 2> ci = {
                node->parent->children[0]->lightBounds.Importance(p, n),
                node->parent->children[1]->lightBounds.Importance(p, n)};
            int childIndex = static_cast<int>(node == node->parent->children[1]);
            DCHECK_GT(ci[childIndex], 0);
            pdf *= ci[childIndex] / (ci[0] + ci[1]);
        }

        Float pInfinite = Float(infiniteLights.size()) / Float(infiniteLights.size() + 1);
        return pdf * (1.f - pInfinite);
    }